

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxml2cpp.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  char **in_RSI;
  long in_FS_OFFSET;
  char16_t *str;
  char16_t *str_1;
  QCoreApplication app;
  DataPointer *in_stack_fffffffffffffde8;
  QDBusXmlToCpp *this;
  QArrayDataPointer<char16_t> local_178;
  undefined1 local_160 [24];
  QArrayDataPointer<char16_t> local_148 [2];
  undefined8 local_118;
  undefined8 uStack_110;
  int local_fc [29];
  QCoreApplication *app_00;
  QDBusXmlToCpp *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_118 = 0xaaaaaaaaaaaaaaaa;
  uStack_110 = 0xaaaaaaaaaaaaaaaa;
  QCoreApplication::QCoreApplication((QCoreApplication *)&local_118,local_fc,in_RSI,0x60a00);
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_148,(Data *)0x0,L"qdbusxml2cpp",0xc);
  this = (QDBusXmlToCpp *)(local_148 + 1);
  QString::QString((QString *)this,in_stack_fffffffffffffde8);
  QCoreApplication::setApplicationName((QString *)this);
  QString::~QString((QString *)0x10f601);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_178,(Data *)0x0,L"0.8",3);
  QString::QString(&this->globalClassName,in_stack_fffffffffffffde8);
  QCoreApplication::setApplicationVersion((QString *)local_160);
  QString::~QString((QString *)0x10f681);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
  app_00 = (QCoreApplication *)0x0;
  this_00 = (QDBusXmlToCpp *)0x0;
  local_fc[0x19] = 0;
  local_fc[0x1a] = 0;
  local_fc[0x1b] = 0;
  local_fc[0x1c] = 0;
  local_fc[0x15] = 0;
  local_fc[0x16] = 0;
  local_fc[0x17] = 0;
  local_fc[0x18] = 0;
  local_fc[0x11] = 0;
  local_fc[0x12] = 0;
  local_fc[0x13] = 0;
  local_fc[0x14] = 0;
  local_fc[0xd] = 0;
  local_fc[0xe] = 0;
  local_fc[0xf] = 0;
  local_fc[0x10] = 0;
  local_fc[9] = 0;
  local_fc[10] = 0;
  local_fc[0xb] = 0;
  local_fc[0xc] = 0;
  local_fc[5] = 0;
  local_fc[6] = 0;
  local_fc[7] = 0;
  local_fc[8] = 0;
  local_fc[1] = 0;
  local_fc[2] = 0;
  local_fc[3] = 0;
  local_fc[4] = 0;
  QDBusXmlToCpp::QDBusXmlToCpp(this);
  iVar2 = QDBusXmlToCpp::run(this_00,app_00);
  QDBusXmlToCpp::~QDBusXmlToCpp(this);
  QCoreApplication::~QCoreApplication((QCoreApplication *)&local_118);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int main(int argc, char **argv)
{
    QCoreApplication app(argc, argv);
    QCoreApplication::setApplicationName(QStringLiteral(PROGRAMNAME));
    QCoreApplication::setApplicationVersion(QStringLiteral(PROGRAMVERSION));

    return QDBusXmlToCpp().run(app);
}